

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Vec_Vec_t * Saig_ManDetectConstrFunc(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  long lVar1;
  FILE *pFile;
  sat_solver *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  uint local_a0;
  int nCands;
  int status;
  int Lit;
  int k;
  int j;
  int i;
  uint *pInfo;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  Aig_Man_t *pFrames;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vInfo;
  Vec_Vec_t *vCands;
  Bar_Progress_t *pProgress;
  int nWordsAlloc;
  int iPat;
  int fVerbose_local;
  int nProps_local;
  int nConfs_local;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  pProgress._4_4_ = 0;
  pProgress._0_4_ = 0x10;
  vCands = (Vec_Vec_t *)0x0;
  vInfo = (Vec_Ptr_t *)0x0;
  local_a0 = 0;
  nWordsAlloc = fVerbose;
  iPat = nProps;
  fVerbose_local = nConfs;
  nProps_local = nFrames;
  _nConfs_local = p;
  iVar2 = Saig_ManPoNum(p);
  if (iVar2 != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2a1,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  iVar2 = Saig_ManPoNum(_nConfs_local);
  if (iVar2 == 1) {
    pSat = (sat_solver *)Saig_ManUnrollCOI(_nConfs_local,nProps_local);
    iVar2 = Aig_ManCoNum((Aig_Man_t *)pSat);
    if (iVar2 != 1) {
      __assert_fail("Aig_ManCoNum(pFrames) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                    ,0x2ab,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
    }
    if (nWordsAlloc != 0) {
      printf("Detecting constraints with %d frames, %d conflicts, and %d propagations.\n",
             (ulong)(uint)nProps_local,(ulong)(uint)fVerbose_local,(ulong)(uint)iPat);
      printf("Frames: ");
      Aig_ManPrintStats((Aig_Man_t *)pSat);
    }
    p_00 = pSat;
    iVar2 = Aig_ManCoNum((Aig_Man_t *)pSat);
    pInfo = (uint *)Cnf_DeriveSimple((Aig_Man_t *)p_00,iVar2);
    pCnf = (Cnf_Dat_t *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pInfo,1,0);
    lVar1 = *(long *)(pInfo + 8);
    pAVar5 = Aig_ManCo((Aig_Man_t *)pSat,0);
    iVar2 = Aig_ObjId(pAVar5);
    nCands = toLitCond(*(int *)(lVar1 + (long)iVar2 * 4),0);
    iVar2 = sat_solver_solve((sat_solver *)pCnf,&nCands,&status,(long)fVerbose_local,0,0,0);
    if (iVar2 == -1) {
      printf("The problem is trivially UNSAT (inductive with k=%d).\n",(ulong)(nProps_local - 1));
      Cnf_DataFree((Cnf_Dat_t *)pInfo);
      sat_solver_delete((sat_solver *)pCnf);
      Aig_ManStop((Aig_Man_t *)pSat);
      p_local = (Aig_Man_t *)0x0;
    }
    else if (iVar2 == 0) {
      printf("Solver could not solve the original problem.\n");
      Cnf_DataFree((Cnf_Dat_t *)pInfo);
      sat_solver_delete((sat_solver *)pCnf);
      Aig_ManStop((Aig_Man_t *)pSat);
      p_local = (Aig_Man_t *)0x0;
    }
    else {
      if (iVar2 != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                      ,0x2cc,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)")
        ;
      }
      iVar2 = Aig_ManObjNumMax((Aig_Man_t *)pSat);
      vNodes = Vec_PtrAllocSimInfo(iVar2,(int)pProgress);
      Vec_PtrCleanSimInfo(vNodes,0,(int)pProgress);
      Saig_CollectSatValues
                ((sat_solver *)pCnf,(Cnf_Dat_t *)pInfo,vNodes,(int *)((long)&pProgress + 4));
      for (k = 0; iVar2 = k, iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(pSat->Mem).BookMarkE),
          pFile = _stdout, iVar2 < iVar3; k = k + 1) {
        pRepr = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(pSat->Mem).BookMarkE,k);
        if ((pRepr != (Aig_Obj_t *)0x0) && (_j = (uint *)Vec_PtrEntry(vNodes,k), (*_j & 1) != 0)) {
          memset(_j,0xff,(long)((int)pProgress << 2));
        }
      }
      iVar2 = Aig_ManObjNumMax((Aig_Man_t *)pSat);
      vCands = (Vec_Vec_t *)Bar_ProgressStart(pFile,iVar2);
      Aig_ManCleanMarkAB((Aig_Man_t *)pSat);
      for (k = 0; iVar2 = k, iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(pSat->Mem).BookMarkE),
          iVar2 < iVar3; k = k + 1) {
        pRepr = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(pSat->Mem).BookMarkE,k);
        if ((pRepr != (Aig_Obj_t *)0x0) &&
           ((iVar2 = Aig_ObjIsNode(pRepr), iVar2 != 0 || (iVar2 = Aig_ObjIsCi(pRepr), iVar2 != 0))))
        {
          Bar_ProgressUpdate((Bar_Progress_t *)vCands,k,(char *)0x0);
          _j = (uint *)Vec_PtrEntry(vNodes,k);
          for (status = 0; (status < (int)pProgress && (_j[status] == 0xffffffff));
              status = status + 1) {
          }
          if (status == (int)pProgress) {
            iVar2 = Saig_DetectTryPolarity
                              ((sat_solver *)pCnf,fVerbose_local,iPat,(Cnf_Dat_t *)pInfo,pRepr,0,
                               vNodes,(int *)((long)&pProgress + 4),nWordsAlloc);
            if (iVar2 != 0) {
              *(ulong *)&pRepr->field_0x18 =
                   *(ulong *)&pRepr->field_0x18 & 0xffffffffffffffef | 0x10;
              local_a0 = local_a0 + 1;
            }
          }
          else {
            for (status = 0; (status < (int)pProgress && (_j[status] == 0)); status = status + 1) {
            }
            if ((status == (int)pProgress) &&
               (iVar2 = Saig_DetectTryPolarity
                                  ((sat_solver *)pCnf,fVerbose_local,iPat,(Cnf_Dat_t *)pInfo,pRepr,1
                                   ,vNodes,(int *)((long)&pProgress + 4),nWordsAlloc), iVar2 != 0))
            {
              *(ulong *)&pRepr->field_0x18 =
                   *(ulong *)&pRepr->field_0x18 & 0xffffffffffffffdf | 0x20;
              local_a0 = local_a0 + 1;
            }
          }
        }
      }
      Bar_ProgressStop((Bar_Progress_t *)vCands);
      if (local_a0 != 0) {
        if (nWordsAlloc != 0) {
          printf("Found %3d classes of candidates.\n",(ulong)local_a0);
        }
        vInfo = (Vec_Ptr_t *)Vec_VecAlloc(nProps_local);
        for (status = 0; status < nProps_local; status = status + 1) {
          for (k = 0; iVar2 = k, iVar3 = Vec_PtrSize(_nConfs_local->vObjs), iVar2 < iVar3; k = k + 1
              ) {
            pRepr = (Aig_Obj_t *)Vec_PtrEntry(_nConfs_local->vObjs,k);
            if ((pRepr != (Aig_Obj_t *)0x0) &&
               (((iVar2 = Aig_ObjIsNode(pRepr), iVar2 != 0 ||
                 (iVar2 = Aig_ObjIsCi(pRepr), iVar2 != 0)) &&
                (pObjNew = _nConfs_local->pObjCopies
                           [(nProps_local * k + nProps_local + -1) - status],
                pObjNew != (Aig_Obj_t *)0x0)))) {
              pAVar6 = Aig_Regular(pObjNew);
              pAVar5 = pRepr;
              if ((*(ulong *)&pAVar6->field_0x18 >> 4 & 1) == 0) {
                pAVar6 = Aig_Regular(pObjNew);
                pAVar5 = pRepr;
                if ((*(ulong *)&pAVar6->field_0x18 >> 5 & 1) != 0) {
                  iVar2 = Aig_IsComplement(pObjNew);
                  pFrames = (Aig_Man_t *)Aig_NotCond(pAVar5,iVar2);
                  for (Lit = 0; Lit < status; Lit = Lit + 1) {
                    pVVar7 = Vec_VecEntry((Vec_Vec_t *)vInfo,Lit);
                    iVar2 = Vec_PtrFind(pVVar7,pFrames);
                    if (-1 < iVar2) break;
                  }
                  if (Lit == status) {
                    Vec_VecPush((Vec_Vec_t *)vInfo,status,pFrames);
                  }
                }
              }
              else {
                iVar2 = Aig_IsComplement(pObjNew);
                pFrames = (Aig_Man_t *)Aig_NotCond(pAVar5,(uint)((iVar2 != 0 ^ 0xffU) & 1));
                for (Lit = 0; Lit < status; Lit = Lit + 1) {
                  pVVar7 = Vec_VecEntry((Vec_Vec_t *)vInfo,Lit);
                  iVar2 = Vec_PtrFind(pVVar7,pFrames);
                  if (-1 < iVar2) break;
                }
                if (Lit == status) {
                  Vec_VecPush((Vec_Vec_t *)vInfo,status,pFrames);
                }
              }
            }
          }
        }
        if (nWordsAlloc != 0) {
          uVar4 = Vec_VecSizeSize((Vec_Vec_t *)vInfo);
          printf("Found %3d candidates.\n",(ulong)uVar4);
          for (status = 0; iVar2 = status, iVar3 = Vec_VecSize((Vec_Vec_t *)vInfo), iVar2 < iVar3;
              status = status + 1) {
            pObj = (Aig_Obj_t *)Vec_VecEntry((Vec_Vec_t *)vInfo,status);
            iVar2 = status;
            uVar4 = Vec_PtrSize((Vec_Ptr_t *)pObj);
            printf("Level %d. Cands  =%d    ",(ulong)(uint)iVar2,(ulong)uVar4);
            printf("\n");
          }
        }
        if (_nConfs_local->pObjCopies != (Aig_Obj_t **)0x0) {
          free(_nConfs_local->pObjCopies);
          _nConfs_local->pObjCopies = (Aig_Obj_t **)0x0;
        }
        Saig_ManFilterUsingInd(_nConfs_local,(Vec_Vec_t *)vInfo,fVerbose_local,iPat,nWordsAlloc);
        iVar2 = Vec_VecSizeSize((Vec_Vec_t *)vInfo);
        if (iVar2 != 0) {
          uVar4 = Vec_VecSizeSize((Vec_Vec_t *)vInfo);
          printf("Found %3d constraints after filtering.\n",(ulong)uVar4);
        }
        if (nWordsAlloc != 0) {
          for (status = 0; iVar2 = status, iVar3 = Vec_VecSize((Vec_Vec_t *)vInfo), iVar2 < iVar3;
              status = status + 1) {
            pObj = (Aig_Obj_t *)Vec_VecEntry((Vec_Vec_t *)vInfo,status);
            iVar2 = status;
            uVar4 = Vec_PtrSize((Vec_Ptr_t *)pObj);
            printf("Level %d. Constr =%d    ",(ulong)(uint)iVar2,(ulong)uVar4);
            printf("\n");
          }
        }
      }
      Vec_PtrFree(vNodes);
      Cnf_DataFree((Cnf_Dat_t *)pInfo);
      sat_solver_delete((sat_solver *)pCnf);
      Aig_ManCleanMarkAB((Aig_Man_t *)pSat);
      Aig_ManStop((Aig_Man_t *)pSat);
      p_local = (Aig_Man_t *)vInfo;
    }
  }
  else {
    printf("The number of outputs is different from 1.\n");
    p_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Vec_t *)p_local;
}

Assistant:

Vec_Vec_t * Saig_ManDetectConstrFunc( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    int iPat = 0, nWordsAlloc = 16;
    Bar_Progress_t * pProgress = NULL;
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vInfo, * vNodes;
    Aig_Obj_t * pObj, * pRepr, * pObjNew;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    unsigned * pInfo;
    int i, j, k, Lit, status, nCands = 0;
    assert( Saig_ManPoNum(p) == 1 );
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The number of outputs is different from 1.\n" );
        return NULL;
    }
//printf( "Implications = %d.\n", Ssw_ManCountImplications(p, nFrames) );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    if ( fVerbose )
    {
        printf( "Detecting constraints with %d frames, %d conflicts, and %d propagations.\n", nFrames, nConfs, nProps );
        printf( "Frames: " );
        Aig_ManPrintStats( pFrames );
    }
//    Aig_ManShow( pFrames, 0, NULL );

    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//printf( "Implications = %d.\n", pSat->qhead );

    // solve the original problem
    Lit = toLitCond( pCnf->pVarNums[Aig_ObjId(Aig_ManCo(pFrames,0))], 0 );
    status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfs, 0, 0, 0 );
    if ( status == l_False )
    {
        printf( "The problem is trivially UNSAT (inductive with k=%d).\n", nFrames-1 );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    if ( status == l_Undef )
    {
        printf( "Solver could not solve the original problem.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    assert( status == l_True );

    // create simulation info
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pFrames), nWordsAlloc );
    Vec_PtrCleanSimInfo( vInfo, 0, nWordsAlloc );
    Saig_CollectSatValues( pSat, pCnf, vInfo, &iPat );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( pInfo[0] & 1 )
            memset( (char*)pInfo, 0xff, 4*nWordsAlloc );
    }
//    Aig_ManShow( pFrames, 0, NULL );
//    Aig_ManShow( p, 0, NULL );

    // consider the nodes for ci=>!Out and label when it holds
    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pFrames) );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        Bar_ProgressUpdate( pProgress, i, NULL );
        // check if the node is available in both polarities
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != ~0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 0, vInfo, &iPat, fVerbose) ) // !pObj is a constr
            {
                pObj->fMarkA = 1, nCands++;
//                printf( "!%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != 0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 1, vInfo, &iPat, fVerbose) ) //  pObj is a constr
            {
                pObj->fMarkB = 1, nCands++;
//                printf( "%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
    }
    Bar_ProgressStop( pProgress );
    if ( nCands )
    {

//        printf( "\n" );
        if ( fVerbose )
            printf( "Found %3d classes of candidates.\n", nCands );
        vCands = Vec_VecAlloc( nFrames );
        for ( k = 0; k < nFrames; k++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                    continue;
                pRepr = p->pObjCopies[nFrames*i + nFrames-1-k];
//                pRepr = p->pObjCopies[nFrames*i + k];
                if ( pRepr == NULL )
                    continue;
                if ( Aig_Regular(pRepr)->fMarkA ) // !pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj, !Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0 )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->!%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
                else if ( Aig_Regular(pRepr)->fMarkB ) //  pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj,  Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0  )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
            }
        }

//        printf( "\n" );
        if ( fVerbose )
        {
            printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }

        ABC_FREE( p->pObjCopies );
        Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
        if ( Vec_VecSizeSize(vCands) )
            printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
        if ( fVerbose )
        {
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }
    }
    Vec_PtrFree( vInfo );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManStop( pFrames );
    return vCands;
}